

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF64
          (BinaryWriterSpec *this,uint64_t f64_bits,ExpectedNan expected)

{
  if (expected == Arithmetic) {
    WriteString(this,"nan:arithmetic");
    return;
  }
  if (expected != Canonical) {
    if (expected == None) {
      Stream::Writef(this->json_stream_,"\"%lu\"",f64_bits);
      return;
    }
    return;
  }
  WriteString(this,"nan:canonical");
  return;
}

Assistant:

void BinaryWriterSpec::WriteF64(uint64_t f64_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%" PRIu64 "\"", f64_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}